

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_insert(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ion_bpp_key_t *piVar1;
  ion_bpp_node_t *piVar2;
  char cVar3;
  ion_bpp_err_t iVar4;
  int iVar5;
  ion_bpp_buffer_t *local_b8;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_key_t *tkey;
  ion_bpp_buffer_t *tbuf;
  ion_bpp_h_node_t *h;
  int height;
  uint lastGEkey;
  ion_bpp_address_t lastGE;
  int local_80;
  ion_bpp_bool_t lastLTvalid;
  ion_bpp_bool_t lastGEvalid;
  uint keyOff;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_buffer_t *root;
  ion_bpp_buffer_t *buf;
  int cc;
  int len;
  ion_bpp_key_t *mkey;
  ion_bpp_external_address_t iStack_28;
  int rc;
  ion_bpp_external_address_t rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  root = (ion_bpp_buffer_t *)((long)handle + 0x20);
  local_80 = 0;
  lastGE._4_4_ = 0;
  tbuf = (ion_bpp_buffer_t *)handle;
  iStack_28 = rec;
  rec_local = (ion_bpp_external_address_t)key;
  key_local = handle;
  if ((uint)(**(ushort **)((long)handle + 0x38) >> 1) == *(int *)((long)handle + 0xb8) * 3) {
    mkey._4_4_ = gatherRoot(handle);
    if (mkey._4_4_ != bErrOk) {
      return mkey._4_4_;
    }
    iVar4 = scatter(key_local,root,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,
                    (ion_bpp_buffer_t **)&lastGEvalid);
    if (iVar4 != bErrOk) {
      return iVar4;
    }
    mkey._4_4_ = 0;
  }
  h._0_4_ = 0;
  while ((undefined1  [40])((undefined1  [40])*root->p & (undefined1  [40])0x1) ==
         (undefined1  [40])0x0) {
    h._0_4_ = (int)h + 1;
    buf._0_4_ = search(key_local,root,(void *)rec_local,iStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH);
    if ((int)buf < 0) {
      iVar4 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + -8),&local_b8);
    }
    else {
      iVar4 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + (long)*(int *)&tbuf->prev + 8),
                       &local_b8);
    }
    if (iVar4 != bErrOk) {
      return iVar4;
    }
    mkey._4_4_ = 0;
    if ((uint)(*(ushort *)local_b8->p >> 1) == *(uint *)&tbuf[4].p) {
      mkey._4_4_ = gather(key_local,root,(ion_bpp_key_t **)&cc,(ion_bpp_buffer_t **)&lastGEvalid);
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      mkey._4_4_ = scatter(key_local,root,_cc,3,(ion_bpp_buffer_t **)&lastGEvalid);
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      buf._0_4_ = search(key_local,root,(void *)rec_local,iStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH
                        );
      if ((int)buf < 0) {
        iVar4 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + -8),&local_b8);
      }
      else {
        iVar4 = readDisk(key_local,*(ion_bpp_address_t *)(_cc + (long)*(int *)&tbuf->prev + 8),
                         &local_b8);
      }
      if (iVar4 != bErrOk) {
        return iVar4;
      }
    }
    mkey._4_4_ = 0;
    if (((int)buf < 0) && (_cc == &root->p->fkey)) {
      if (local_80 != 0) {
        lastGE._4_4_ = 1;
      }
    }
    else {
      local_80 = 1;
      lastGE._4_4_ = 0;
      _height = root->adr;
      h._4_4_ = (int)_cc - ((int)root->p + 0x20);
      if ((int)buf < 0) {
        h._4_4_ = h._4_4_ - *(int *)((long)&tbuf[4].p + 4);
      }
    }
    root = local_b8;
  }
  if (maxHeight < (int)h) {
    maxHeight = (int)h;
  }
  iVar5 = search(key_local,root,(void *)rec_local,iStack_28,(ion_bpp_key_t **)&cc,MODE_MATCH);
  if (iVar5 == -1) {
    if (((*(int *)((long)&tbuf->prev + 4) == 0) && (*(ushort *)root->p >> 1 != 0)) &&
       (cVar3 = (*(code *)tbuf->p)(rec_local,_cc,*(undefined4 *)&tbuf->prev), cVar3 == '\0')) {
      return bErrDupKeys;
    }
  }
  else {
    if (iVar5 == 0) {
      return bErrDupKeys;
    }
    if (iVar5 == 1) {
      if ((*(int *)((long)&tbuf->prev + 4) == 0) &&
         (cVar3 = (*(code *)tbuf->p)(rec_local,_cc,*(undefined4 *)&tbuf->prev), cVar3 == '\0')) {
        return bErrDupKeys;
      }
      _cc = _cc + *(int *)((long)&tbuf[4].p + 4);
    }
  }
  lastLTvalid = (int)_cc - ((int)root->p + 0x20);
  iVar5 = (uint)(*(ushort *)root->p >> 1) * *(int *)((long)&tbuf[4].p + 4) - lastLTvalid;
  if (iVar5 != 0) {
    memmove(_cc + *(int *)((long)&tbuf[4].p + 4),_cc,(long)iVar5);
  }
  memcpy(_cc,(void *)rec_local,(long)*(int *)&tbuf->prev);
  *(ion_bpp_external_address_t *)(_cc + *(int *)&tbuf->prev) = iStack_28;
  piVar1 = _cc + (long)*(int *)&tbuf->prev + 8;
  piVar1[0] = '\0';
  piVar1[1] = '\0';
  piVar1[2] = '\0';
  piVar1[3] = '\0';
  piVar1[4] = '\0';
  piVar1[5] = '\0';
  piVar1[6] = '\0';
  piVar1[7] = '\0';
  piVar2 = root->p;
  *(ushort *)piVar2 = *(ushort *)piVar2 & 1 | ((*(ushort *)piVar2 >> 1) + 1) * 2;
  mkey._4_4_ = writeDisk(root);
  if (mkey._4_4_ == bErrOk) {
    if ((lastLTvalid == boolean_false) && (lastGE._4_4_ != 0)) {
      mkey._4_4_ = readDisk(key_local,_height,(ion_bpp_buffer_t **)&tkey);
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      cbuf = (ion_bpp_buffer_t *)(*(long *)(tkey + 0x18) + 0x20);
      memcpy(cbuf,(void *)rec_local,(long)*(int *)&tbuf->prev);
      *(ion_bpp_external_address_t *)((long)&cbuf->next + (long)*(int *)&tbuf->prev) = iStack_28;
      iVar4 = writeDisk((ion_bpp_buffer_t *)tkey);
      if (iVar4 != bErrOk) {
        return iVar4;
      }
    }
    nKeysIns = nKeysIns + 1;
    return bErrOk;
  }
  return mkey._4_4_;
}

Assistant:

ion_bpp_err_t
b_insert(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to insertion point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */

					if (!h->dupKeys && (0 != ct(buf)) && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					break;

				case ION_CC_EQ:	/* key = mkey */
					return bErrDupKeys;
					break;

				case ION_CC_GT:	/* key > mkey */

					if (!h->dupKeys && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					mkey += ks(1);
					break;
			}

			/* shift items GE key to right */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf)) - keyOff;

			if (len) {
				memmove(mkey + ks(1), mkey, len);
			}

			/* insert new key */
			memcpy(key(mkey), key, h->keySize);
			rec(mkey)		= rec;
			childGE(mkey)	= 0;
			ct(buf)++;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if new key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				/* tkey = fkey(tbuf) + lastGEkey; */
				tkey		= fkey(tbuf);
				memcpy(key(tkey), key, h->keySize);
				rec(tkey)	= rec;

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysIns++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}